

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O3

int __thiscall Fl_Text_Buffer::rewind_lines(Fl_Text_Buffer *this,int startPos,int nLines)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  
  if (1 < startPos) {
    iVar1 = this->mGapStart;
    if (iVar1 < startPos) {
      uVar7 = (ulong)(uint)startPos;
      uVar4 = startPos - 1;
      iVar3 = -1;
      do {
        if ((this->mBuf[uVar7 + (long)(this->mGapEnd - iVar1) + -1] == '\n') &&
           (iVar3 = iVar3 + 1, nLines <= iVar3)) {
          return (int)uVar7;
        }
        uVar7 = uVar7 - 1;
        uVar4 = uVar4 - 1;
      } while ((long)iVar1 < (long)uVar7);
      if ((long)uVar7 < 1) {
        return 0;
      }
    }
    else {
      uVar4 = startPos - 1;
      iVar3 = -1;
    }
    lVar5 = (ulong)uVar4 + 1;
    do {
      if ((this->mBuf[lVar5 + -1] == '\n') && (iVar3 = iVar3 + 1, nLines <= iVar3)) {
        return (int)lVar5;
      }
      lVar6 = lVar5 + -1;
      bVar2 = 0 < lVar5;
      lVar5 = lVar6;
    } while (lVar6 != 0 && bVar2);
  }
  return 0;
}

Assistant:

int Fl_Text_Buffer::rewind_lines(int startPos, int nLines)
{
  IS_UTF8_ALIGNED2(this, (startPos))
  
  int pos = startPos - 1;
  if (pos <= 0)
    return 0;
  
  int gapLen = mGapEnd - mGapStart;
  int lineCount = -1;
  while (pos >= mGapStart) {
    if (mBuf[pos + gapLen] == '\n') {
      if (++lineCount >= nLines) {
        IS_UTF8_ALIGNED2(this, (pos+1))
	return pos + 1;
      }
    }
    pos--;
  }
  while (pos >= 0) {
    if (mBuf[pos] == '\n') {
      if (++lineCount >= nLines) {
        IS_UTF8_ALIGNED2(this, (pos+1))
	return pos + 1;
      }
    }
    pos--;
  }
  return 0;
}